

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O0

void set_patched_distance(pfdistances_patched *distances,loc grid,wchar_t distance)

{
  wchar_t wVar1;
  wchar_t wVar2;
  int iVar3;
  wchar_t patchi;
  wchar_t patchx;
  wchar_t patchy;
  wchar_t distance_local;
  pfdistances_patched *distances_local;
  loc grid_local;
  
  distances_local._4_4_ = grid.y;
  if (((((long)grid < 0) || (distances->height <= distances_local._4_4_)) ||
      (distances_local._0_4_ = grid.x, (wchar_t)distances_local < L'\0')) ||
     (distances->width <= (wchar_t)distances_local)) {
    __assert_fail("grid.y >= 0 && grid.y < distances->height && grid.x >= 0 && grid.x < distances->width"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                  ,0x309,"void set_patched_distance(struct pfdistances_patched *, struct loc, int)")
    ;
  }
  wVar1 = distances_local._4_4_ >> ((byte)distances->patch_shift & 0x1f);
  if ((wVar1 < L'\0') || (distances->npatchy <= wVar1)) {
    __assert_fail("patchy >= 0 && patchy < distances->npatchy",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                  ,0x30b,"void set_patched_distance(struct pfdistances_patched *, struct loc, int)")
    ;
  }
  wVar2 = (wchar_t)distances_local >> ((byte)distances->patch_shift & 0x1f);
  if ((L'\xffffffff' < wVar2) && (wVar2 < distances->npatchx)) {
    if (distances->patches[wVar1][wVar2] == (int *)0x0) {
      __assert_fail("distances->patches[patchy][patchx]",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                    ,0x30e,
                    "void set_patched_distance(struct pfdistances_patched *, struct loc, int)");
    }
    iVar3 = ((distances_local._4_4_ & distances->patch_mask) <<
            ((byte)distances->patch_shift & 0x1f)) +
            ((wchar_t)distances_local & distances->patch_mask);
    if ((-1 < iVar3) && (iVar3 < distances->patch_size * distances->patch_size)) {
      distances->patches[wVar1][wVar2][iVar3] = distance;
      return;
    }
    __assert_fail("patchi >= 0 && patchi < distances->patch_size * distances->patch_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                  ,0x312,"void set_patched_distance(struct pfdistances_patched *, struct loc, int)")
    ;
  }
  __assert_fail("patchx >= 0 && patchx < distances->npatchx",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                ,0x30d,"void set_patched_distance(struct pfdistances_patched *, struct loc, int)");
}

Assistant:

static void set_patched_distance(struct pfdistances_patched *distances,
		struct loc grid, int distance)
{
	int patchy, patchx, patchi;

	assert(grid.y >= 0 && grid.y < distances->height
		&& grid.x >= 0 && grid.x < distances->width);
	patchy = grid.y >> distances->patch_shift;
	assert(patchy >= 0 && patchy < distances->npatchy);
	patchx = grid.x >> distances->patch_shift;
	assert(patchx >= 0 && patchx < distances->npatchx);
	assert(distances->patches[patchy][patchx]);
	patchi = ((grid.y & distances->patch_mask) << distances->patch_shift)
		+ (grid.x & distances->patch_mask);
	assert(patchi >= 0 && patchi < distances->patch_size
		* distances->patch_size);
	distances->patches[patchy][patchx][patchi] = distance;
}